

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

Vec_Wrd_t * Gia_ManComputeTruths(Gia_Man_t *p,int nCutSize,int nLutNum,int fReverse)

{
  int iVar1;
  int iVar2;
  int *pArray;
  Gia_Obj_t *pRoot;
  word *pwVar3;
  int local_48;
  int nWords;
  int k;
  int i;
  word *pTruth;
  Vec_Int_t vLeaves;
  Vec_Wrd_t *vTruths;
  int fReverse_local;
  int nLutNum_local;
  int nCutSize_local;
  Gia_Man_t *p_local;
  
  iVar1 = Abc_Truth6WordNum(nCutSize);
  vLeaves.pArray = &Vec_WrdAlloc(iVar1 * nLutNum)->nCap;
  Gia_ObjComputeTruthTableStart(p,nCutSize);
  nWords = 1;
  do {
    iVar2 = Gia_ManObjNum(p);
    if (iVar2 <= nWords) {
      Gia_ObjComputeTruthTableStop(p);
      iVar1 = Vec_WrdCap((Vec_Wrd_t *)vLeaves.pArray);
      if (iVar1 != 0x10) {
        iVar1 = Vec_WrdSize((Vec_Wrd_t *)vLeaves.pArray);
        iVar2 = Vec_WrdCap((Vec_Wrd_t *)vLeaves.pArray);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_WrdCap(vTruths) == 16 || Vec_WrdSize(vTruths) == Vec_WrdCap(vTruths)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                        ,0xa4,"Vec_Wrd_t *Gia_ManComputeTruths(Gia_Man_t *, int, int, int)");
        }
      }
      return (Vec_Wrd_t *)vLeaves.pArray;
    }
    iVar2 = Gia_ObjIsLut(p,nWords);
    if (iVar2 != 0) {
      pTruth._0_4_ = Gia_ObjLutSize(p,nWords);
      pTruth._4_4_ = (int)pTruth;
      vLeaves._0_8_ = Gia_ObjLutFanins(p,nWords);
      iVar2 = Vec_IntCheckUniqueSmall((Vec_Int_t *)&pTruth);
      if (iVar2 == 0) {
        __assert_fail("Vec_IntCheckUniqueSmall(&vLeaves)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                      ,0x99,"Vec_Wrd_t *Gia_ManComputeTruths(Gia_Man_t *, int, int, int)");
      }
      pArray = Vec_IntArray((Vec_Int_t *)&pTruth);
      iVar2 = Vec_IntSize((Vec_Int_t *)&pTruth);
      Vec_IntSelectSort(pArray,iVar2);
      if (fReverse == 0) {
        Vec_IntReverseOrder((Vec_Int_t *)&pTruth);
      }
      pRoot = Gia_ManObj(p,nWords);
      pwVar3 = Gia_ObjComputeTruthTableCut(p,pRoot,(Vec_Int_t *)&pTruth);
      for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
        Vec_WrdPush((Vec_Wrd_t *)vLeaves.pArray,pwVar3[local_48]);
      }
    }
    nWords = nWords + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManComputeTruths( Gia_Man_t * p, int nCutSize, int nLutNum, int fReverse )
{
    Vec_Wrd_t * vTruths;
    Vec_Int_t vLeaves;
    word * pTruth;
    int i, k, nWords;
    nWords = Abc_Truth6WordNum( nCutSize );
    vTruths = Vec_WrdAlloc( nWords * nLutNum );
    Gia_ObjComputeTruthTableStart( p, nCutSize );
    Gia_ManForEachLut( p, i )
    {
        // collect and sort fanins
        vLeaves.nCap = vLeaves.nSize = Gia_ObjLutSize( p, i );
        vLeaves.pArray = Gia_ObjLutFanins( p, i );
        assert( Vec_IntCheckUniqueSmall(&vLeaves) );
        Vec_IntSelectSort( Vec_IntArray(&vLeaves), Vec_IntSize(&vLeaves) );
        if ( !fReverse )
            Vec_IntReverseOrder( &vLeaves );
        // compute truth table
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, i), &vLeaves );
        for ( k = 0; k < nWords; k++ )
            Vec_WrdPush( vTruths, pTruth[k] );
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
    }
    Gia_ObjComputeTruthTableStop( p );
    assert( Vec_WrdCap(vTruths) == 16 || Vec_WrdSize(vTruths) == Vec_WrdCap(vTruths) );
    return vTruths;
}